

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::multiDrawArrays
          (ReferenceContext *this,deUint32 mode,int *first,int *count,int primCount)

{
  int primCount_local;
  int *count_local;
  int *first_local;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  return;
}

Assistant:

void ReferenceContext::multiDrawArrays (deUint32 mode, const int* first, const int* count, int primCount)
{
	DE_UNREF(mode);
	DE_UNREF(first);
	DE_UNREF(count);
	DE_UNREF(primCount);

	// not supported in gles, prevent accidental use
	DE_ASSERT(false);
}